

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::Destroy(FlowGraph *this)

{
  OpCode OVar1;
  Loop *this_00;
  code *pcVar2;
  anon_class_16_2_202918d3 fn;
  FlowEdge **ppFVar3;
  NodeBase *pNVar4;
  BasicBlock **this_01;
  IRKind IVar5;
  bool bVar6;
  RegionType RVar7;
  BOOL BVar8;
  LabelInstr *pLVar9;
  JITTimeFunctionBody *this_02;
  undefined4 *puVar10;
  Type_conflict pSVar11;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  Type *ppFVar13;
  BasicBlock *pBVar14;
  Instr *pIVar15;
  LabelInstr *pLVar16;
  LabelInstr *pLVar17;
  BranchInstr *pBVar18;
  Region *pRVar19;
  Region *pRVar20;
  FlowGraph *this_03;
  bool local_1ed;
  bool local_1dd;
  bool local_189;
  bool local_151;
  bool local_141;
  LabelInstr *labelInstr_2;
  BasicBlock *block_2;
  Region *predRegion;
  BasicBlock *intermediateBlock;
  BasicBlock *predBlock;
  FlowEdge **__edge_1;
  Iterator __iter_2;
  Region *region;
  BasicBlock *block_1;
  BranchInstr *branchInstr;
  Instr *lastInstr;
  LabelInstr *labelInstr_1;
  BasicBlock *succ;
  FlowEdge **__edge;
  Iterator __iter_1;
  BasicBlock **loopBlock;
  Iterator __iter;
  BasicBlock *loopTail;
  LabelInstr *local_80;
  LabelInstr *labelInstr;
  Instr *firstInstr;
  BasicBlock *block;
  FlowGraph *pFStack_60;
  BOOL fHasTry;
  FlowGraph *this_local;
  LabelInstr *local_50;
  LabelInstr *local_48;
  LabelInstr *local_40;
  BasicBlock ***local_38;
  bool local_29;
  FlowEdge ***local_28;
  bool local_19;
  FlowEdge ***local_18;
  bool local_9;
  
  pFStack_60 = this;
  block._4_4_ = Func::HasTry(this->func);
  if (block._4_4_ != 0) {
    RemoveUnreachableBlocks(this);
  }
  firstInstr = (Instr *)this->blockList;
  do {
    if (firstInstr == (Instr *)0x0) {
      if (block._4_4_ != 0) {
        for (region = (Region *)this->blockList; region != (Region *)0x0;
            region = *(Region **)region) {
          if (((ulong)region->matchingCatchRegion & 1) == 0) {
            pIVar15 = BasicBlock::GetFirstInstr((BasicBlock *)region);
            pLVar9 = IR::Instr::AsLabelInstr(pIVar15);
            __iter_2.current = (NodeBase *)IR::LabelInstr::GetRegion(pLVar9);
            pSVar12 = &BasicBlock::GetPredList((BasicBlock *)region)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            ___edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                                  (pSVar12);
LAB_00535d97:
            local_28 = &__edge_1;
            if (__iter_2.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar6) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            ppFVar3 = __edge_1;
            pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next
                                (&(__iter_2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            bVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                              ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,
                               pSVar11);
            if (!bVar6) {
              SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(__iter_2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            }
            local_19 = !bVar6;
            if (local_19) {
              ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                   ((Iterator *)&__edge_1);
              pBVar14 = FlowEdge::GetPred(*ppFVar13);
              if (pBVar14 == (BasicBlock *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x6e7,"(predBlock)","predBlock");
                if (!bVar6) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              pIVar15 = BasicBlock::GetFirstInstr(pBVar14);
              pLVar9 = IR::Instr::AsLabelInstr(pIVar15);
              pRVar20 = IR::LabelInstr::GetRegion(pLVar9);
              pIVar15 = BasicBlock::GetLastInstr(pBVar14);
              if (pIVar15 == (Instr *)0x0) {
                if ((Region *)__iter_2.current != pRVar20) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x6ed,"(region == predRegion)",
                                     "Bad region propagation through empty block");
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
                goto LAB_00535d97;
              }
              pIVar15 = BasicBlock::GetLastInstr(pBVar14);
              pNVar4 = __iter_2.current;
              OVar1 = pIVar15->m_opcode;
              if (OVar1 == Br) {
                pIVar15 = BasicBlock::GetLastInstr(pBVar14);
                pBVar18 = IR::Instr::AsBranchInstr(pIVar15);
                pNVar4 = __iter_2.current;
                if ((pBVar18->m_leaveConvToBr & 1U) == 0) {
                  RVar7 = Region::GetType((Region *)__iter_2.current);
                  if ((RVar7 == RegionTypeCatch) && ((Region *)__iter_2.current != pRVar20)) {
                    RVar7 = Region::GetType(pRVar20);
                    if (RVar7 != RegionTypeTry) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 1;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                         ,0x728,"(predRegion->GetType() == RegionTypeTry)",
                                         "Bad region type for the try");
                      if (!bVar6) {
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 0;
                    }
                  }
                  else {
                    RVar7 = Region::GetType((Region *)__iter_2.current);
                    if ((RVar7 == RegionTypeFinally) && ((Region *)__iter_2.current != pRVar20)) {
                      bVar6 = Region::IsNonExceptingFinally(pRVar20);
                      if ((!bVar6) && (RVar7 = Region::GetType(pRVar20), RVar7 != RegionTypeTry)) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar10 = 1;
                        bVar6 = Js::Throw::ReportAssert
                                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                           ,0x72d,
                                           "(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry)"
                                           ,"Bad region type for the try");
                        if (!bVar6) {
                          pcVar2 = (code *)invalidInstructionException();
                          (*pcVar2)();
                        }
                        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar10 = 0;
                      }
                    }
                    else {
                      bVar6 = Region::IsNonExceptingFinally(pRVar20);
                      if ((!bVar6) && ((Region *)__iter_2.current != pRVar20)) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar10 = 1;
                        bVar6 = Js::Throw::ReportAssert
                                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                           ,0x732,
                                           "(predRegion->IsNonExceptingFinally() || region == predRegion)"
                                           ,"Bad region propagation through interior block");
                        if (!bVar6) {
                          pcVar2 = (code *)invalidInstructionException();
                          (*pcVar2)();
                        }
                        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                        *puVar10 = 0;
                      }
                    }
                  }
                }
                else {
                  pRVar20 = Region::GetParent(pRVar20);
                  if ((Region *)pNVar4 != pRVar20) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                       ,0x724,"(region == predRegion->GetParent())",
                                       "Bad region prop in finally");
                    if (!bVar6) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
              else if ((ushort)(OVar1 - TryCatch) < 2) {
                pRVar19 = Region::GetParent((Region *)__iter_2.current);
                if (pRVar19 != pRVar20) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x6f5,"(region->GetParent() == predRegion)",
                                     "Bad region prop on entry to try-catch/finally");
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
                pLVar9 = (LabelInstr *)BasicBlock::GetFirstInstr((BasicBlock *)region);
                pIVar15 = BasicBlock::GetLastInstr(pBVar14);
                pBVar18 = IR::Instr::AsBranchInstr(pIVar15);
                pLVar16 = IR::BranchInstr::GetTarget(pBVar18);
                if (pLVar9 == pLVar16) {
                  pIVar15 = BasicBlock::GetLastInstr(pBVar14);
                  if (pIVar15->m_opcode == TryCatch) {
                    RVar7 = Region::GetType((Region *)__iter_2.current);
                    if (RVar7 != RegionTypeCatch) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 1;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                         ,0x6fa,"(region->GetType() == RegionTypeCatch)",
                                         "Bad region type on entry to catch");
                      if (!bVar6) {
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 0;
                    }
                  }
                  else {
                    RVar7 = Region::GetType((Region *)__iter_2.current);
                    if (RVar7 != RegionTypeFinally) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 1;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                         ,0x6fe,"(region->GetType() == RegionTypeFinally)",
                                         "Bad region type on entry to finally");
                      if (!bVar6) {
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar10 = 0;
                    }
                  }
                }
                else {
                  RVar7 = Region::GetType((Region *)__iter_2.current);
                  if (RVar7 != RegionTypeTry) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                       ,0x703,"(region->GetType() == RegionTypeTry)",
                                       "Bad region type on entry to try");
                    if (!bVar6) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
              else if (OVar1 == LeaveNull) {
                pRVar19 = Region::GetParent(pRVar20);
                if (((Region *)pNVar4 != pRVar19) &&
                   (((Region *)__iter_2.current != pRVar20 ||
                    (bVar6 = Func::IsLoopBodyInTry(this->func), !bVar6)))) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x70d,
                                     "(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()))"
                                     ,"Bad region prop on leaving try-catch/finally");
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
              else if (OVar1 == Leave) {
                pRVar19 = Region::GetParent(pRVar20);
                if ((((Region *)pNVar4 != pRVar19) &&
                    ((RVar7 = Region::GetType(pRVar20), RVar7 != RegionTypeTry ||
                     (pRVar19 = Region::GetMatchingFinallyRegion(pRVar20,false),
                     pRVar19 != (Region *)__iter_2.current)))) &&
                   (((Region *)__iter_2.current != pRVar20 ||
                    (bVar6 = Func::IsLoopBodyInTry(this->func), !bVar6)))) {
                  pIVar15 = BasicBlock::GetLastInstr(pBVar14);
                  pIVar15 = IR::Instr::GetPrevRealInstr(pIVar15);
                  if (((pIVar15->m_opcode != BailOnEarlyExit) ||
                      (RVar7 = Region::GetType((Region *)__iter_2.current),
                      RVar7 != RegionTypeFinally)) ||
                     (bVar6 = Func::IsSimpleJit(this->func), !bVar6)) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                       ,0x70a,
                                       "(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) || (region == predRegion && this->func->IsLoopBodyInTry() || (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())))"
                                       ,"Bad region prop on leaving try-catch/finally");
                    if (!bVar6) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
              else if (OVar1 == BrOnException) {
                bVar6 = Func::DoGlobOpt(this->func);
                if (bVar6) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x716,"(!this->func->DoGlobOpt())","!this->func->DoGlobOpt()")
                  ;
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
              else if (((OVar1 == BrOnNoException) &&
                       (RVar7 = Region::GetType((Region *)__iter_2.current), RVar7 != RegionTypeTry)
                       ) && ((RVar7 = Region::GetType((Region *)__iter_2.current),
                             RVar7 != RegionTypeCatch &&
                             (RVar7 = Region::GetType((Region *)__iter_2.current),
                             RVar7 != RegionTypeFinally)))) {
                RVar7 = Region::GetType(pRVar20);
                if (RVar7 == RegionTypeFinally) {
                  pIVar15 = BasicBlock::GetLastInstr(pBVar14);
                  pBVar18 = IR::Instr::AsBranchInstr(pIVar15);
                  if (((byte)pBVar18->field_0x58 >> 4 & 1) != 0) goto LAB_00535d97;
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x71e,
                                   "(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit))"
                                   ,
                                   "region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit)"
                                  );
                if (!bVar6) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              goto LAB_00535d97;
            }
            RVar7 = Region::GetType((Region *)__iter_2.current);
            if (RVar7 == RegionTypeRoot) {
              pRVar20 = Region::GetMatchingTryRegion((Region *)__iter_2.current);
              if ((((pRVar20 != (Region *)0x0) ||
                   (pRVar20 = Region::GetMatchingCatchRegion((Region *)__iter_2.current),
                   pRVar20 != (Region *)0x0)) ||
                  (pRVar20 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,true),
                  pRVar20 != (Region *)0x0)) ||
                 (pRVar20 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,false),
                 pRVar20 != (Region *)0x0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x73f,
                                   "(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
                                   ,
                                   "!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)"
                                  );
                if (!bVar6) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
            }
            else if (RVar7 == 2) {
              bVar6 = Func::DoOptimizeTry(this->func);
              if ((bVar6) ||
                 ((bVar6 = Func::IsSimpleJit(this->func), bVar6 &&
                  ((*(uint *)&this->func->field_0x240 >> 4 & 1) != 0)))) {
                pRVar20 = Region::GetMatchingCatchRegion((Region *)__iter_2.current);
                pRVar19 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,true);
                local_1dd = false;
                if (pRVar19 != (Region *)0x0) {
                  pRVar19 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,false);
                  local_1dd = pRVar19 != (Region *)0x0;
                }
                if ((pRVar20 != (Region *)0x0) == local_1dd) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x745,
                                     "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)))"
                                     ,
                                     "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false))"
                                    );
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
              else {
                pRVar20 = Region::GetMatchingCatchRegion((Region *)__iter_2.current);
                pRVar19 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,true);
                bVar6 = false;
                if (pRVar19 != (Region *)0x0) {
                  pRVar19 = Region::GetMatchingFinallyRegion((Region *)__iter_2.current,false);
                  bVar6 = pRVar19 == (Region *)0x0;
                }
                if ((pRVar20 != (Region *)0x0) == bVar6) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x749,
                                     "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)))"
                                     ,
                                     "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
                                    );
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
            }
            else if ((RVar7 - 3 < 2) &&
                    (pRVar20 = Region::GetMatchingTryRegion((Region *)__iter_2.current),
                    pRVar20 == (Region *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x74f,"(region->GetMatchingTryRegion())",
                                 "region->GetMatchingTryRegion()");
              if (!bVar6) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
          }
        }
      }
      if (block._4_4_ != 0) {
        for (labelInstr_2 = (LabelInstr *)this->blockList; labelInstr_2 != (LabelInstr *)0x0;
            labelInstr_2 = (LabelInstr *)(labelInstr_2->super_Instr)._vptr_Instr) {
          this_03 = (FlowGraph *)BasicBlock::GetFirstInstr((BasicBlock *)labelInstr_2);
          this_local = this_03;
          IVar5 = IR::Instr::GetKind((Instr *)this_03);
          local_1ed = true;
          if (IVar5 != InstrKindLabel) {
            local_1ed = IR::Instr::IsProfiledLabelInstr((Instr *)this_03);
          }
          if (local_1ed != false) {
            pIVar15 = BasicBlock::GetFirstInstr((BasicBlock *)labelInstr_2);
            pLVar9 = IR::Instr::AsLabelInstr(pIVar15);
            BVar8 = IR::LabelInstr::IsUnreferenced(pLVar9);
            if (BVar8 != 0) {
              IR::Instr::Remove(&pLVar9->super_Instr);
            }
          }
        }
      }
      *(uint *)&this->func->field_0x240 = *(uint *)&this->func->field_0x240 & 0xfffbffff;
      return;
    }
    pLVar9 = (LabelInstr *)BasicBlock::GetFirstInstr((BasicBlock *)firstInstr);
    labelInstr = pLVar9;
    if ((((ulong)firstInstr->m_prev & 1) == 0) || ((*(ushort *)&firstInstr->m_prev >> 1 & 1) != 0))
    {
      if (((*(ushort *)&firstInstr->m_prev >> 2 & 1) != 0) &&
         ((*(ushort *)&firstInstr->m_prev >> 1 & 1) == 0)) {
        __iter.current = (NodeBase *)0x0;
        local_48 = pLVar9;
        IVar5 = IR::Instr::GetKind((Instr *)pLVar9);
        local_151 = true;
        if (IVar5 != InstrKindLabel) {
          local_151 = IR::Instr::IsProfiledLabelInstr((Instr *)pLVar9);
        }
        if ((local_151 == false) ||
           (pLVar9 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr),
           (pLVar9->field_0x78 & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x69e,
                             "(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop)"
                             ,"Label not marked as loop top...");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        _loopBlock = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                               ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                                &firstInstr->m_next->m_func);
LAB_005357d6:
        local_38 = &loopBlock;
        if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        this_01 = loopBlock;
        pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar6 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)this_01,
                           pSVar11);
        if (!bVar6) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_29 = !bVar6;
        if (local_29) {
          __iter_1.current =
               (NodeBase *)
               SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&loopBlock);
          if ((*(ushort *)&((Type)(__iter_1.current)->next)->field_0x18 & 1) == 0) {
            pSVar12 = &BasicBlock::GetSuccList((BasicBlock *)(__iter_1.current)->next)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar12)
            ;
            do {
              local_18 = &__edge;
              if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
              {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                   ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar6) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              ppFVar3 = __edge;
              pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next
                                  (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
              bVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                                ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3
                                 ,pSVar11);
              if (!bVar6) {
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
              }
              local_9 = !bVar6;
              if (!local_9) goto LAB_005357d6;
              ppFVar13 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                   ((Iterator *)&__edge);
              pBVar14 = FlowEdge::GetSucc(*ppFVar13);
              if (pBVar14 == (BasicBlock *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x6a1,"(succ)","succ");
                if (!bVar6) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
            } while (pBVar14 != (BasicBlock *)firstInstr);
            __iter.current = (__iter_1.current)->next;
          }
          goto LAB_005357d6;
        }
        if (__iter.current == (NodeBase *)0x0) {
          pLVar9 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr);
          pLVar9->field_0x78 = pLVar9->field_0x78 & 0xfe;
        }
        else {
          pIVar15 = BasicBlock::GetLastInstr((BasicBlock *)__iter.current);
          bVar6 = IR::Instr::IsBranchInstr(pIVar15);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x6ad,"(loopTail->GetLastInstr()->IsBranchInstr())",
                               "LastInstr of loop should always be a branch no?");
            if (!bVar6) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          this_00 = (Loop *)firstInstr->m_next;
          pIVar15 = BasicBlock::GetFirstInstr((BasicBlock *)firstInstr);
          pLVar9 = IR::Instr::AsLabelInstr(pIVar15);
          Loop::SetLoopTopInstr(this_00,pLVar9);
        }
      }
      if (block._4_4_ != 0) {
        UpdateRegionForBlock(this,(BasicBlock *)firstInstr);
      }
      pLVar9 = labelInstr;
      local_50 = labelInstr;
      IVar5 = IR::Instr::GetKind(&labelInstr->super_Instr);
      local_189 = true;
      if (IVar5 != InstrKindLabel) {
        local_189 = IR::Instr::IsProfiledLabelInstr(&pLVar9->super_Instr);
      }
      if (local_189 != false) {
        pLVar16 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr);
        IR::LabelInstr::UnlinkBasicBlock(pLVar16);
        BVar8 = IR::LabelInstr::IsUnreferenced(pLVar16);
        pLVar9 = labelInstr;
        if ((BVar8 != 0) && (block._4_4_ == 0)) {
          pLVar17 = (LabelInstr *)BasicBlock::GetLastInstr((BasicBlock *)firstInstr);
          if (pLVar9 == pLVar17) {
            IR::Instr::Remove(&pLVar16->super_Instr);
            goto LAB_00535d00;
          }
          IR::Instr::Remove(&pLVar16->super_Instr);
        }
      }
      pIVar15 = BasicBlock::GetLastInstr((BasicBlock *)firstInstr);
      bVar6 = IR::Instr::IsBranchInstr(pIVar15);
      if (bVar6) {
        pBVar18 = IR::Instr::AsBranchInstr(pIVar15);
        bVar6 = IR::BranchInstr::IsConditional(pBVar18);
        if ((!bVar6) &&
           (pLVar9 = IR::BranchInstr::GetTarget(pBVar18),
           pLVar9 == (LabelInstr *)(pBVar18->super_Instr).m_next)) {
          IR::Instr::Remove(&pBVar18->super_Instr);
        }
      }
    }
    else {
      local_40 = pLVar9;
      IVar5 = IR::Instr::GetKind((Instr *)pLVar9);
      local_141 = true;
      if (IVar5 != InstrKindLabel) {
        local_141 = IR::Instr::IsProfiledLabelInstr((Instr *)pLVar9);
      }
      if (local_141 != false) {
        local_80 = IR::Instr::AsLabelInstr(&labelInstr->super_Instr);
        IR::LabelInstr::UnlinkBasicBlock(local_80);
        if (block._4_4_ == 0) {
          this_02 = Func::GetJITFunctionBody(this->func);
          bVar6 = JITTimeFunctionBody::IsCoroutine(this_02);
          if (bVar6) {
            fn.labelInstr = &local_80;
            fn.this = this;
            Func::MapUntilYieldOffsetResumeLabels<FlowGraph::Destroy()::__0>(this->func,fn);
          }
          BVar8 = IR::LabelInstr::IsUnreferenced(local_80);
          if (BVar8 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x690,"(labelInstr->IsUnreferenced())",
                               "labelInstr->IsUnreferenced()");
            if (!bVar6) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          IR::Instr::Remove(&local_80->super_Instr);
        }
      }
    }
LAB_00535d00:
    firstInstr = (Instr *)firstInstr->_vptr_Instr;
  } while( true );
}

Assistant:

void
FlowGraph::Destroy(void)
{
    BOOL fHasTry = this->func->HasTry();
    if (fHasTry)
    {
        // Do unreachable code removal up front to avoid problems
        // with unreachable back edges, etc.
        this->RemoveUnreachableBlocks();
    }

    FOREACH_BLOCK_ALL(block, this)
    {
        IR::Instr * firstInstr = block->GetFirstInstr();
        if (block->isDeleted && !block->isDead)
        {
            if (firstInstr->IsLabelInstr())
            {
                IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
                labelInstr->UnlinkBasicBlock();
                // Removing the label for non try blocks as we have a deleted block which has the label instruction
                // still not removed; this prevents the assert for cases where the deleted blocks fall through to a helper block,
                // i.e. helper introduced by polymorphic inlining bailout.
                // Skipping Try blocks as we have dependency on blocks to get the last instr(see below in this function)
                if (!fHasTry)
                {
                    if (this->func->GetJITFunctionBody()->IsCoroutine())
                    {
                        // the label could be a yield resume label, in which case we also need to remove it from the YieldOffsetResumeLabels list
                        this->func->MapUntilYieldOffsetResumeLabels([this, &labelInstr](int i, const YieldOffsetResumeLabel& yorl)
                        {
                            if (labelInstr == yorl.Second())
                            {
                                labelInstr->m_hasNonBranchRef = false;
                                this->func->RemoveYieldOffsetResumeLabel(yorl);
                                return true;
                            }
                            return false;
                        });
                    }

                    Assert(labelInstr->IsUnreferenced());
                    labelInstr->Remove();
                }
            }
            continue;
        }

        if (block->isLoopHeader && !block->isDead)
        {
            // Mark the tail block of this loop (the last back-edge).  The register allocator
            // uses this to lexically find loops.
            BasicBlock *loopTail = nullptr;

            AssertMsg(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop,
                "Label not marked as loop top...");
            FOREACH_BLOCK_IN_LOOP(loopBlock, block->loop)
            {
                FOREACH_SUCCESSOR_BLOCK(succ, loopBlock)
                {
                    if (succ == block)
                    {
                        loopTail = loopBlock;
                        break;
                    }
                } NEXT_SUCCESSOR_BLOCK;
            } NEXT_BLOCK_IN_LOOP;

            if (loopTail)
            {
                AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");
                block->loop->SetLoopTopInstr(block->GetFirstInstr()->AsLabelInstr());
            }
            else
            {
                // This loop doesn't have a back-edge: that is, it is not a loop
                // anymore...
                firstInstr->AsLabelInstr()->m_isLoopTop = FALSE;
            }
        }

        if (fHasTry)
        {
            this->UpdateRegionForBlock(block);
        }

        if (firstInstr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
            labelInstr->UnlinkBasicBlock();
            if (labelInstr->IsUnreferenced() && !fHasTry)
            {
                // This is an unreferenced label, probably added by FG building.
                // Delete it now to make extended basic blocks visible.
                if (firstInstr == block->GetLastInstr())
                {
                    labelInstr->Remove();
                    continue;
                }
                else
                {
                    labelInstr->Remove();
                }
            }
        }

        IR::Instr * lastInstr = block->GetLastInstr();
        if (lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();
            if (!branchInstr->IsConditional() && branchInstr->GetTarget() == branchInstr->m_next)
            {
                // Remove branch to next
                branchInstr->Remove();
            }
        }
    }
    NEXT_BLOCK;

#if DBG

    if (fHasTry)
    {
        // Now that all blocks have regions, we should see consistently propagated regions at all
        // block boundaries.
        FOREACH_BLOCK(block, this)
        {
            Region * region = block->GetFirstInstr()->AsLabelInstr()->GetRegion();
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                BasicBlock* intermediateBlock = block;
                Region * predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predBlock->GetLastInstr() == nullptr)
                {
                    AssertMsg(region == predRegion, "Bad region propagation through empty block");
                }
                else
                {
                    switch (predBlock->GetLastInstr()->m_opcode)
                    {
                    case Js::OpCode::TryCatch:
                    case Js::OpCode::TryFinally:
                        AssertMsg(region->GetParent() == predRegion, "Bad region prop on entry to try-catch/finally");
                        if (intermediateBlock->GetFirstInstr() == predBlock->GetLastInstr()->AsBranchInstr()->GetTarget())
                        {
                            if (predBlock->GetLastInstr()->m_opcode == Js::OpCode::TryCatch)
                            {
                                AssertMsg(region->GetType() == RegionTypeCatch, "Bad region type on entry to catch");
                            }
                            else
                            {
                                AssertMsg(region->GetType() == RegionTypeFinally, "Bad region type on entry to finally");
                            }
                        }
                        else
                        {
                            AssertMsg(region->GetType() == RegionTypeTry, "Bad region type on entry to try");
                        }
                        break;
                    case Js::OpCode::Leave:
                        AssertMsg(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) ||
                            (region == predRegion && this->func->IsLoopBodyInTry() ||
                            // edge from early exit to finally in simplejit - in fulljit this Leave would have been deadcoded due to preceeding BailOutOnEarlyExit
                            (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())), "Bad region prop on leaving try-catch/finally");
                        break;
                    case Js::OpCode::LeaveNull:
                        AssertMsg(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()), "Bad region prop on leaving try-catch/finally");
                        break;

                    // If the try region has a branch out of the loop,
                    // - the branch is moved out of the loop as part of break block removal, and
                    // - BrOnException is inverted to BrOnNoException and a Br is inserted after it.
                    // Otherwise,
                    // - FullJit: BrOnException is removed in the forward pass.
                    case Js::OpCode::BrOnException:
                        Assert(!this->func->DoGlobOpt());
                        break;
                    case Js::OpCode::BrOnNoException:
                        Assert(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally ||
                            // A BrOnException from finally to early exit can be converted to BrOnNoException and Br
                            // The Br block maybe a common successor block for early exit along with the BrOnNoException block
                            // Region from Br block will be picked up from a predecessor which is not BrOnNoException due to early exit
                            // See test0() in test/EH/tryfinallytests.js
                            (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit));
                        break;
                    case Js::OpCode::Br:
                        if (predBlock->GetLastInstr()->AsBranchInstr()->m_leaveConvToBr)
                        {
                            // Leave converted to Br in finally region
                            AssertMsg(region == predRegion->GetParent(), "Bad region prop in finally");
                        }
                        else if (region->GetType() == RegionTypeCatch && region != predRegion)
                        {
                            AssertMsg(predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else if (region->GetType() == RegionTypeFinally && region != predRegion)
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || region == predRegion, "Bad region propagation through interior block");
                        }
                        break;
                    default:
                        break;
                    }
                }
            }
            NEXT_PREDECESSOR_BLOCK;

            switch (region->GetType())
            {
            case RegionTypeRoot:
                Assert(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false));
                break;

            case RegionTypeTry:
                if (this->func->DoOptimizeTry() || (this->func->IsSimpleJit() && this->func->hasBailout))
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)));
                }
                else
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)));
                }
                break;

            case RegionTypeCatch:
            case RegionTypeFinally:
                Assert(region->GetMatchingTryRegion());
                break;
            }
        }
        NEXT_BLOCK;
    }
#endif
    if (fHasTry)
    {
        FOREACH_BLOCK_ALL(block, this)
        {
            if (block->GetFirstInstr()->IsLabelInstr())
            {
                IR::LabelInstr *labelInstr = block->GetFirstInstr()->AsLabelInstr();
                if (labelInstr->IsUnreferenced())
                {
                    // This is an unreferenced label, probably added by FG building.
                    // Delete it now to make extended basic blocks visible.
                    labelInstr->Remove();
                }
            }
        } NEXT_BLOCK;
    }
    this->func->isFlowGraphValid = false;
}